

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdNode * Cudd_SubsetWithMaskVars
                   (DdManager *dd,DdNode *f,DdNode **vars,int nvars,DdNode **maskVars,int mvars)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  int iVar7;
  DdNode *pDVar8;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  ulong uVar9;
  DdNode *pDVar10;
  ulong uVar11;
  DdNode *pDVar12;
  DdNode *pDVar13;
  byte bVar14;
  DdNode *pDVar15;
  long lVar16;
  ulong uVar17;
  double dVar18;
  double dVar19;
  
  pDVar8 = Cudd_Support(dd,f);
  piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  Cudd_RecursiveDeref(dd,pDVar8);
  uVar3 = dd->size;
  lVar16 = (long)(int)uVar3;
  __ptr = malloc(lVar16 * 8);
  if (__ptr == (void *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    uVar9 = 0;
    uVar11 = 0;
    if (0 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    for (; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined8 *)((long)__ptr + uVar9 * 8) = 0;
    }
    uVar17 = 0;
    uVar9 = (ulong)(uint)mvars;
    if (mvars < 1) {
      uVar9 = uVar17;
    }
    for (; uVar9 != uVar17; uVar17 = uVar17 + 1) {
      pDVar8 = Cudd_Cofactor(dd,f,maskVars[uVar17]);
      piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      dVar18 = Cudd_CountMinterm(dd,pDVar8,nvars);
      Cudd_RecursiveDeref(dd,pDVar8);
      pDVar8 = Cudd_Cofactor(dd,f,(DdNode *)((ulong)maskVars[uVar17] ^ 1));
      piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      dVar19 = Cudd_CountMinterm(dd,pDVar8,nvars);
      *(double *)((long)__ptr + uVar17 * 8) = dVar18 - dVar19;
      Cudd_RecursiveDeref(dd,pDVar8);
    }
    __ptr_00 = malloc(lVar16 + 1);
    if (__ptr_00 == (void *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      __ptr_01 = malloc(lVar16 << 2);
      if (__ptr_01 == (void *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
        free(__ptr);
        __ptr = __ptr_00;
      }
      else {
        for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
          *(undefined1 *)((long)__ptr_00 + uVar17) = 0x32;
          *(undefined4 *)((long)__ptr_01 + uVar17 * 4) = 0;
        }
        *(undefined1 *)((long)__ptr_00 + lVar16) = 0;
        __ptr_02 = malloc((long)nvars << 2);
        if (__ptr_02 == (void *)0x0) {
          dd->errorCode = CUDD_MEMORY_OUT;
          free(__ptr);
          free(__ptr_00);
          __ptr = __ptr_01;
        }
        else {
          uVar17 = 0;
          uVar11 = (ulong)(uint)nvars;
          if (nvars < 1) {
            uVar11 = uVar17;
          }
          for (; uVar11 != uVar17; uVar17 = uVar17 + 1) {
            *(DdHalfWord *)((long)__ptr_02 + uVar17 * 4) = vars[uVar17]->index;
          }
          if (f != (DdNode *)0x0) {
            pDVar8 = dd->one;
            pDVar10 = (DdNode *)((ulong)pDVar8 ^ 1);
            if (pDVar10 != f) {
              pDVar13 = f;
              if (pDVar8 != f) {
                while (pDVar12 = (DdNode *)((ulong)pDVar13 & 0xfffffffffffffffe), pDVar8 != pDVar12)
                {
                  pDVar4 = (pDVar12->type).kids.T;
                  pDVar5 = (pDVar12->type).kids.E;
                  pDVar15 = (DdNode *)((ulong)pDVar5 ^ 1);
                  pDVar6 = (DdNode *)((ulong)pDVar4 ^ 1);
                  if (((ulong)pDVar13 & 1) == 0) {
                    pDVar15 = pDVar5;
                    pDVar6 = pDVar4;
                  }
                  if (0.0 <= *(double *)((long)__ptr + (ulong)pDVar12->index * 8)) {
                    pDVar13 = pDVar15;
                    if (pDVar6 != pDVar10) {
                      pDVar13 = pDVar6;
                    }
                    bVar14 = pDVar6 == pDVar10 ^ 0x31;
                  }
                  else {
                    pDVar13 = pDVar6;
                    if (pDVar15 != pDVar10) {
                      pDVar13 = pDVar15;
                    }
                    bVar14 = pDVar15 == pDVar10 | 0x30;
                  }
                  *(byte *)((long)__ptr_00 + (ulong)pDVar12->index) = bVar14;
                }
              }
              pDVar8 = Cudd_ReadOne(dd);
              piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar10 = Cudd_ReadOne(dd);
              for (uVar17 = 0; uVar11 != uVar17; uVar17 = uVar17 + 1) {
                cVar2 = *(char *)((long)__ptr_00 + (long)*(int *)((long)__ptr_02 + uVar17 * 4));
                if (cVar2 == '1') {
                  pDVar13 = vars[uVar17];
LAB_006330c0:
                  pDVar13 = Cudd_bddIte(dd,pDVar8,pDVar13,(DdNode *)((ulong)pDVar10 ^ 1));
                  if (pDVar13 == (DdNode *)0x0) {
                    free(__ptr);
                    free(__ptr_00);
                    free(__ptr_01);
                    free(__ptr_02);
                    goto LAB_006332b4;
                  }
                  piVar1 = (int *)(((ulong)pDVar13 & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  Cudd_RecursiveDeref(dd,pDVar8);
                }
                else {
                  pDVar13 = pDVar8;
                  if (cVar2 == '0') {
                    pDVar13 = (DdNode *)((ulong)vars[uVar17] ^ 1);
                    goto LAB_006330c0;
                  }
                }
                pDVar8 = pDVar13;
              }
              Cudd_RecursiveDeref(dd,pDVar8);
              for (uVar17 = 0; uVar9 != uVar17; uVar17 = uVar17 + 1) {
                *(undefined4 *)((long)__ptr_01 + (ulong)maskVars[uVar17]->index * 4) = 1;
              }
              for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
                lVar16 = (long)*(int *)((long)__ptr_02 + uVar9 * 4);
                if (*(int *)((long)__ptr_01 + lVar16 * 4) == 0) {
                  bVar14 = 0x32;
LAB_00633168:
                  *(byte *)((long)__ptr_00 + lVar16) = bVar14;
                }
                else if (*(char *)((long)__ptr_00 + lVar16) == '2') {
                  bVar14 = *(double *)((long)__ptr + lVar16 * 8) < 0.0 ^ 0x31;
                  goto LAB_00633168;
                }
              }
              pDVar8 = Cudd_ReadOne(dd);
              piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar10 = Cudd_ReadOne(dd);
              uVar9 = 0;
              do {
                if (uVar11 == uVar9) {
                  pDVar10 = Cudd_bddAnd(dd,f,pDVar8);
                  piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  Cudd_RecursiveDeref(dd,pDVar8);
                  iVar7 = Cudd_bddLeq(dd,pDVar10,f);
                  if (iVar7 == 0) {
                    Cudd_RecursiveDeref(dd,pDVar10);
                    pDVar10 = (DdNode *)0x0;
                  }
                  else {
                    piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
                    *piVar1 = *piVar1 + -1;
                  }
                  free(__ptr);
                  free(__ptr_00);
                  free(__ptr_01);
                  free(__ptr_02);
                  return pDVar10;
                }
                cVar2 = *(char *)((long)__ptr_00 + (long)*(int *)((long)__ptr_02 + uVar9 * 4));
                if (cVar2 == '1') {
                  pDVar13 = vars[uVar9];
LAB_006331d4:
                  pDVar13 = Cudd_bddIte(dd,pDVar8,pDVar13,(DdNode *)((ulong)pDVar10 ^ 1));
                  if (pDVar13 == (DdNode *)0x0) {
                    free(__ptr);
                    free(__ptr_00);
                    free(__ptr_01);
                    free(__ptr_02);
LAB_006332b4:
                    Cudd_RecursiveDeref(dd,pDVar8);
                    return (DdNode *)0x0;
                  }
                  piVar1 = (int *)(((ulong)pDVar13 & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  Cudd_RecursiveDeref(dd,pDVar8);
                }
                else {
                  pDVar13 = pDVar8;
                  if (cVar2 == '0') {
                    pDVar13 = (DdNode *)((ulong)vars[uVar9] ^ 1);
                    goto LAB_006331d4;
                  }
                }
                uVar9 = uVar9 + 1;
                pDVar8 = pDVar13;
              } while( true );
            }
          }
          free(__ptr);
          free(__ptr_00);
          free(__ptr_01);
          __ptr = __ptr_02;
        }
      }
    }
    free(__ptr);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_SubsetWithMaskVars(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick a cube */,
  DdNode ** vars /* array of variables */,
  int  nvars /* size of <code>vars</code> */,
  DdNode ** maskVars /* array of variables */,
  int  mvars /* size of <code>maskVars</code> */)
{
    double      *weight;
    char        *string;
    int         i, size;
    int         *indices, *mask;
    int         result;
    DdNode      *zero, *cube, *newCube, *subset;
    DdNode      *cof;

    DdNode      *support;
    support = Cudd_Support(dd,f);
    cuddRef(support);
    Cudd_RecursiveDeref(dd,support);

    zero = Cudd_Not(dd->one);
    size = dd->size;

    weight = ABC_ALLOC(double,size);
    if (weight == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        weight[i] = 0.0;
    }
    for (i = 0; i < mvars; i++) {
        cof = Cudd_Cofactor(dd, f, maskVars[i]);
        cuddRef(cof);
        weight[i] = Cudd_CountMinterm(dd, cof, nvars);
        Cudd_RecursiveDeref(dd,cof);

        cof = Cudd_Cofactor(dd, f, Cudd_Not(maskVars[i]));
        cuddRef(cof);
        weight[i] -= Cudd_CountMinterm(dd, cof, nvars);
        Cudd_RecursiveDeref(dd,cof);
    }

    string = ABC_ALLOC(char, size + 1);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(weight);
        return(NULL);
    }
    mask = ABC_ALLOC(int, size);
    if (mask == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(weight);
        ABC_FREE(string);
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        string[i] = '2';
        mask[i] = 0;
    }
    string[size] = '\0';
    indices = ABC_ALLOC(int,nvars);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(weight);
        ABC_FREE(string);
        ABC_FREE(mask);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) {
        indices[i] = vars[i]->index;
    }

    result = ddPickRepresentativeCube(dd,f,weight,string);
    if (result == 0) {
        ABC_FREE(weight);
        ABC_FREE(string);
        ABC_FREE(mask);
        ABC_FREE(indices);
        return(NULL);
    }

    cube = Cudd_ReadOne(dd);
    cuddRef(cube);
    zero = Cudd_Not(Cudd_ReadOne(dd));
    for (i = 0; i < nvars; i++) {
        if (string[indices[i]] == '0') {
            newCube = Cudd_bddIte(dd,cube,Cudd_Not(vars[i]),zero);
        } else if (string[indices[i]] == '1') {
            newCube = Cudd_bddIte(dd,cube,vars[i],zero);
        } else
            continue;
        if (newCube == NULL) {
            ABC_FREE(weight);
            ABC_FREE(string);
            ABC_FREE(mask);
            ABC_FREE(indices);
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(newCube);
        Cudd_RecursiveDeref(dd,cube);
        cube = newCube;
    }
    Cudd_RecursiveDeref(dd,cube);

    for (i = 0; i < mvars; i++) {
        mask[maskVars[i]->index] = 1;
    }
    for (i = 0; i < nvars; i++) {
        if (mask[indices[i]]) {
            if (string[indices[i]] == '2') {
                if (weight[indices[i]] >= 0.0)
                    string[indices[i]] = '1';
                else
                    string[indices[i]] = '0';
            }
        } else {
            string[indices[i]] = '2';
        }
    }

    cube = Cudd_ReadOne(dd);
    cuddRef(cube);
    zero = Cudd_Not(Cudd_ReadOne(dd));

    /* Build result BDD. */
    for (i = 0; i < nvars; i++) {
        if (string[indices[i]] == '0') {
            newCube = Cudd_bddIte(dd,cube,Cudd_Not(vars[i]),zero);
        } else if (string[indices[i]] == '1') {
            newCube = Cudd_bddIte(dd,cube,vars[i],zero);
        } else
            continue;
        if (newCube == NULL) {
            ABC_FREE(weight);
            ABC_FREE(string);
            ABC_FREE(mask);
            ABC_FREE(indices);
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(newCube);
        Cudd_RecursiveDeref(dd,cube);
        cube = newCube;
    }

    subset = Cudd_bddAnd(dd,f,cube);
    cuddRef(subset);
    Cudd_RecursiveDeref(dd,cube);

    /* Test. */
    if (Cudd_bddLeq(dd,subset,f)) {
        cuddDeref(subset);
    } else {
        Cudd_RecursiveDeref(dd,subset);
        subset = NULL;
    }

    ABC_FREE(weight);
    ABC_FREE(string);
    ABC_FREE(mask);
    ABC_FREE(indices);
    return(subset);

}